

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

UniValue * JSONRPCTransactionError(TransactionError terr,string *err_string)

{
  long lVar1;
  size_type sVar2;
  undefined4 in_ESI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  TransactionError in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffbc;
  TransactionError in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (sVar2 == 0) {
    RPCErrorFromTransactionError(in_stack_ffffffffffffff68);
    common::TransactionErrorString(in_stack_ffffffffffffffdc);
    JSONRPCError(in_stack_ffffffffffffffbc,(string *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  else {
    RPCErrorFromTransactionError(in_stack_ffffffffffffff68);
    JSONRPCError(in_stack_ffffffffffffffbc,(string *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue JSONRPCTransactionError(TransactionError terr, const std::string& err_string)
{
    if (err_string.length() > 0) {
        return JSONRPCError(RPCErrorFromTransactionError(terr), err_string);
    } else {
        return JSONRPCError(RPCErrorFromTransactionError(terr), TransactionErrorString(terr).original);
    }
}